

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::SetIntegrationRule
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,int ord)

{
  TPZManVector<int,_3> *in_RDI;
  TPZManVector<int,_3> order;
  TPZVec<int> *ord_00;
  TPZIntTriang *in_stack_ffffffffffffffb0;
  _func_int **in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  TPZManVector<int,_3> *in_stack_ffffffffffffffd0;
  
  ord_00 = (TPZVec<int> *)&stack0xffffffffffffffc0;
  TPZManVector<int,_3>::TPZManVector
            (in_stack_ffffffffffffffd0,(int64_t)in_stack_ffffffffffffffc8,
             (int *)in_stack_ffffffffffffffc0);
  TPZIntTriang::SetOrder(in_stack_ffffffffffffffb0,ord_00,(int)((ulong)in_RDI >> 0x20));
  TPZManVector<int,_3>::~TPZManVector(in_RDI);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetIntegrationRule(int ord) {
	TPZManVector<int,3> order(TSHAPE::Dimension,ord);
	this->fIntRule.SetOrder(order);
}